

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O2

void __thiscall MemMap::~MemMap(MemMap *this)

{
  if (this->mmap_ptr != (uint8_t *)0x0) {
    munmap(this->mmap_ptr,this->fsize);
  }
  if (1 < this->fd + 1U) {
    close(this->fd);
  }
  std::__cxx11::string::~string((string *)&this->fname);
  return;
}

Assistant:

MemMap::~MemMap() {
    if (mmap_ptr != nullptr) {
        munmap(mmap_ptr, fsize);
    }

    if (fd != -1 && fd != 0) {
        close(fd);
    }
}